

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesOptionsWidget.cxx
# Opt level: O3

void __thiscall
cmCursesOptionsWidget::cmCursesOptionsWidget
          (cmCursesOptionsWidget *this,int width,int height,int left,int top)

{
  cmCursesWidget::cmCursesWidget(&this->super_cmCursesWidget,width,height,left,top);
  (this->super_cmCursesWidget)._vptr_cmCursesWidget =
       (_func_int **)&PTR__cmCursesOptionsWidget_005acc80;
  (this->Options).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Options).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Options).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_cmCursesWidget).Type = BOOL;
  set_field_fore((this->super_cmCursesWidget).Field,0);
  set_field_back((this->super_cmCursesWidget).Field,0x10000);
  field_opts_off((this->super_cmCursesWidget).Field,0x200);
  return;
}

Assistant:

cmCursesOptionsWidget::cmCursesOptionsWidget(int width, int height,
                                       int left, int top) :
  cmCursesWidget(width, height, left, top)
{
  this->Type = cmState::BOOL; // this is a bit of a hack
  // there is no option type, and string type causes ccmake to cast
  // the widget into a string widget at some point.  BOOL is safe for
  // now.
  set_field_fore(this->Field,  A_NORMAL);
  set_field_back(this->Field,  A_STANDOUT);
  field_opts_off(this->Field,  O_STATIC);
}